

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

double __thiscall logging::log(logging *this,double __x)

{
  char in_AL;
  char *in_RDX;
  uint in_ESI;
  char *pcVar1;
  ostream *poVar2;
  ostream *poVar3;
  double dVar4;
  long lStack_500;
  va_list ap;
  undefined1 local_4d8 [48];
  double local_4a8;
  char text [1024];
  
  if (in_AL != '\0') {
    local_4a8 = __x;
  }
  if (in_ESI == 4) {
    lStack_500 = 0xc;
LAB_00151da6:
    *(int *)(&this->lastrelog + lStack_500) = *(int *)(&this->lastrelog + lStack_500) + 1;
  }
  else if (in_ESI == 3) {
    lStack_500 = 0x10;
    goto LAB_00151da6;
  }
  if (4 < (int)in_ESI) {
    return __x;
  }
  if ((int)in_ESI < (int)this->minLevel) {
    return __x;
  }
  if ((int)in_ESI < 1) {
    poVar3 = (ostream *)&std::cout;
  }
  else {
    poVar3 = (ostream *)&std::cerr;
  }
  memset(text,0,0x3ff);
  ap[0].reg_save_area = local_4d8;
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].gp_offset = 0x18;
  ap[0].fp_offset = 0x30;
  vsnprintf(text,0x3ff,in_RDX,ap);
  if (this->lastrelog == true) {
    this->lastrelog = false;
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  if (this->useColor == true) {
    switch(in_ESI) {
    case 0:
      poVar2 = (ostream *)&std::cout;
      pcVar1 = "\x1b[1;30m";
      break;
    default:
      goto switchD_00151e50_caseD_1;
    case 2:
      poVar2 = (ostream *)&std::cerr;
      pcVar1 = "\x1b[1;32m";
      break;
    case 3:
      std::operator<<((ostream *)&std::cerr,"\x1b[1;33m");
      goto LAB_00151e81;
    case 4:
      std::operator<<((ostream *)&std::cerr,"\x1b[1;31m");
LAB_00151eb4:
      poVar2 = (ostream *)&std::cerr;
      pcVar1 = "ERROR: ";
    }
  }
  else {
    if (in_ESI != 3) {
      if (in_ESI != 4) goto switchD_00151e50_caseD_1;
      goto LAB_00151eb4;
    }
LAB_00151e81:
    poVar2 = (ostream *)&std::cerr;
    pcVar1 = "WARNING: ";
  }
  std::operator<<(poVar2,pcVar1);
switchD_00151e50_caseD_1:
  std::operator<<(poVar3,text);
  if (((this->useColor == true) && (in_ESI < 5)) && (in_ESI != 1)) {
    std::operator<<(poVar3,"\x1b[0;m");
  }
  dVar4 = (double)std::ostream::flush();
  return dVar4;
}

Assistant:

void logging::log(loglevel level, const char* fmt, ... ) {

	// Save some statistics
	if(level == ERROR)
		cntErrors++;
	if(level == WARNING)
		cntWarnings++;


	// Check if level suffices...
	if( ! doPrint(level) )
		return;

	// Default output of log message
	std::ostream & os  = level >= INFO ? std::cerr : std::cout;

	char text[1024];
	memset(text, 0, sizeof(char)*1023);

	va_list ap;
	va_start(ap, fmt);
	vsnprintf(text, 1023, fmt, ap);
	va_end(ap);


	// Make a new line if last cmd was a relog command
	if(lastrelog)
	{
		lastrelog=false;
		os << std::endl;
	}

	// Switch color
	if( useColor )
	{
		switch( level )
		{
			case ERROR:
				os << "\033[1;31m";
				break;
			case WARNING:
				os << "\033[1;33m";
				break;
			case GOODNEWS:
				os << "\033[1;32m";
				break;
			case DEBUG:
				os << "\033[1;30m";
				break;
			default:
				break;
		}
	}


	switch( level )
	{
		case ERROR:
			os << "ERROR: ";
			break;
		case WARNING:
			os << "WARNING: ";
			break;
		default:
			break;
	}

	os << text;

	if( useColor ) {
		if( level==ERROR || level==WARNING || level==GOODNEWS || level==DEBUG )	
		os << "\033[0;m";
	}

	os.flush();
}